

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove5<(moira::Instr)71,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 uVar2;
  undefined8 in_RAX;
  bool bVar3;
  bool error;
  bool error_1;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar1 = computeEA<(moira::Mode)6,(moira::Size)4,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)4,128ul>(this,uVar1,(bool *)((long)&uStack_38 + 6));
  if (uStack_38._6_1_ == '\0') {
    bVar3 = SUB41(uVar1 >> 0x1f,0);
    (this->reg).sr.n = bVar3;
    (this->reg).sr.z = uVar1 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar2 = computeEA<(moira::Mode)5,(moira::Size)4,0ul>(this,opcode >> 9 & 7);
    writeM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,uVar2,uVar1,(bool *)((long)&uStack_38 + 7));
    if (uStack_38._7_1_ == '\0') {
      uVar2 = (this->reg).pc;
      (this->reg).pc0 = uVar2;
      (this->queue).ird = (this->queue).irc;
      uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
      (this->queue).irc = (u16)uVar2;
      (this->reg).sr.n = bVar3;
      (this->reg).sr.z = uVar1 == 0;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
  }
  return;
}

Assistant:

void
Moira::execMove5(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_DI,S> (dst, data)) return;
    prefetch<POLLIPL>();
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}